

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O3

void __thiscall wasm::StackIROptimizer::vacuum(StackIROptimizer *this)

{
  StackIR *pSVar1;
  pointer ppSVar2;
  uint uVar3;
  ulong uVar4;
  
  pSVar1 = this->insts;
  ppSVar2 = (pSVar1->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((pSVar1->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar2) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      if ((ppSVar2[uVar4] != (StackInst *)0x0) && (ppSVar2[uVar4]->origin->_id == NopId)) {
        ppSVar2[uVar4] = (StackInst *)0x0;
        pSVar1 = this->insts;
        ppSVar2 = (pSVar1->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < (ulong)((long)(pSVar1->
                                   super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3)
            );
  }
  return;
}

Assistant:

void StackIROptimizer::vacuum() {
  // In the wasm binary format a nop is never needed. (In Binaryen IR, in
  // comparison, it is necessary e.g. in a function body or an if arm.)
  //
  // It is especially important to remove nops because we add nops when we
  // read wasm into Binaryen IR. That is, this avoids a potential increase in
  // code size.
  for (Index i = 0; i < insts.size(); i++) {
    auto*& inst = insts[i];
    if (inst && inst->origin->is<Nop>()) {
      inst = nullptr;
    }
  }
}